

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O1

void __thiscall DummyTest_Empty_Test::~DummyTest_Empty_Test(DummyTest_Empty_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(DummyTest, Empty) {
    Deque<int> d;
    ASSERT_TRUE(d.empty());
    d.push_back(1);
    ASSERT_FALSE(d.empty());
    d.pop_back();
    ASSERT_TRUE(d.empty());
}